

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O1

void __thiscall Rml::Context::CreateDragClone(Context *this,Element *element)

{
  ElementDocument *this_00;
  code *pcVar1;
  Vector2f VVar2;
  bool bVar3;
  ElementDocument *pEVar4;
  Element *pEVar5;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  ElementPtr element_drag_clone;
  Vector2f projected_mouse_position;
  _Head_base<0UL,_Rml::Element_*,_false> local_b0;
  undefined1 local_a8 [8];
  Vector2f local_a0;
  undefined1 local_98 [40];
  _Alloc_hider local_70;
  PropertyDefinition *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider _Stack_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  if ((this->cursor_proxy)._M_t.super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
      _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
      super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl == (Element *)0x0) {
    bVar3 = Assert("Unable to create drag clone, no cursor proxy document.",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Context.cpp"
                   ,0x4df);
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  ReleaseDragClone(this);
  Element::Clone((Element *)local_a8);
  if (local_a8 == (undefined1  [8])0x0) {
    Log::Message(LT_ERROR,"Unable to duplicate drag clone.");
  }
  else {
    pEVar4 = Element::GetOwnerDocument(element);
    if (pEVar4 != (ElementDocument *)0x0) {
      this_00 = (ElementDocument *)
                (this->cursor_proxy)._M_t.
                super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
      local_48._0_8_ =
           (pEVar4->style_sheet_container).
           super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_48._8_8_ =
           (pEVar4->style_sheet_container).
           super___shared_ptr<Rml::StyleSheetContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_)->_M_use_count + 1;
        }
      }
      ElementDocument::SetStyleSheetContainer(this_00,(SharedPtr<StyleSheetContainer> *)local_48);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
      }
    }
    this->drag_clone = (Element *)local_a8;
    local_b0._M_head_impl = (Element *)local_a8;
    local_a8 = (undefined1  [8])0x0;
    Element::AppendChild
              ((this->cursor_proxy)._M_t.
               super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
               super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
               super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,(ElementPtr *)&local_b0,
               true);
    if (local_b0._M_head_impl != (Element *)0x0) {
      (*((local_b0._M_head_impl)->super_ScriptInterface).super_Releasable._vptr_Releasable[2])();
    }
    local_b0._M_head_impl = (Element *)0x0;
    VVar2 = Element::GetAbsoluteOffset(element,Border);
    local_38._8_4_ = extraout_XMM0_Dc;
    local_38._0_4_ = VVar2.x;
    local_38._4_4_ = VVar2.y;
    local_38._12_4_ = extraout_XMM0_Dd;
    local_a0.y = (float)(this->mouse_position).y;
    local_a0.x = (float)(this->mouse_position).x;
    pEVar5 = Element::GetParentNode(element);
    if (pEVar5 != (Element *)0x0) {
      Element::Project(pEVar5,&local_a0);
    }
    pEVar5 = this->drag_clone;
    local_98._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_98,2);
    local_70._M_p = (pointer)0xffffffff00000001;
    local_68 = (PropertyDefinition *)0x0;
    local_60._M_allocated_capacity._0_4_ = 0xffffffff;
    local_60._8_8_ = 0;
    _Stack_50._M_p = (pointer)0x0;
    Element::SetProperty(pEVar5,Position,(Property *)local_98);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p);
    }
    Variant::~Variant((Variant *)local_98);
    pEVar5 = this->drag_clone;
    local_98._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_98,(float)local_38._0_4_ - local_a0.x);
    local_70._M_p = (pointer)0xffffffff00000040;
    local_68 = (PropertyDefinition *)0x0;
    local_60._M_allocated_capacity._0_4_ = 0xffffffff;
    local_60._8_8_ = 0;
    _Stack_50._M_p = (pointer)0x0;
    Element::SetProperty(pEVar5,Left,(Property *)local_98);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p);
    }
    Variant::~Variant((Variant *)local_98);
    pEVar5 = this->drag_clone;
    local_98._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_98,(float)local_38._4_4_ - local_a0.y);
    local_70._M_p = (pointer)0xffffffff00000040;
    local_68 = (PropertyDefinition *)0x0;
    local_60._M_allocated_capacity._0_4_ = 0xffffffff;
    local_60._8_8_ = 0;
    _Stack_50._M_p = (pointer)0x0;
    Element::SetProperty(pEVar5,Top,(Property *)local_98);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p);
    }
    Variant::~Variant((Variant *)local_98);
    pEVar5 = this->drag_clone;
    local_98._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_98,0.0);
    local_70._M_p = (pointer)0xffffffff00000040;
    local_68 = (PropertyDefinition *)0x0;
    local_60._M_allocated_capacity._0_4_ = 0xffffffff;
    local_60._8_8_ = 0;
    _Stack_50._M_p = (pointer)0x0;
    Element::SetProperty(pEVar5,MarginLeft,(Property *)local_98);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p);
    }
    Variant::~Variant((Variant *)local_98);
    pEVar5 = this->drag_clone;
    local_98._0_8_ = (pointer)0x2d;
    Variant::Set((Variant *)local_98,0.0);
    local_70._M_p = (pointer)0xffffffff00000040;
    local_68 = (PropertyDefinition *)0x0;
    local_60._M_allocated_capacity._0_4_ = 0xffffffff;
    local_60._8_8_ = 0;
    _Stack_50._M_p = (pointer)0x0;
    Element::SetProperty(pEVar5,MarginTop,(Property *)local_98);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_50._M_p);
    }
    Variant::~Variant((Variant *)local_98);
    pEVar5 = this->drag_clone;
    local_98._0_8_ = local_98 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"drag","");
    Element::SetPseudoClass(pEVar5,(String *)local_98,true);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
    }
  }
  if (local_a8 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_a8 + 0x10))();
  }
  return;
}

Assistant:

void Context::CreateDragClone(Element* element)
{
	RMLUI_ASSERTMSG(cursor_proxy, "Unable to create drag clone, no cursor proxy document.");

	ReleaseDragClone();

	// Instance the drag clone.
	ElementPtr element_drag_clone = element->Clone();
	if (!element_drag_clone)
	{
		Log::Message(Log::LT_ERROR, "Unable to duplicate drag clone.");
		return;
	}

	// Set the style sheet on the cursor proxy.
	if (ElementDocument* document = element->GetOwnerDocument())
	{
		// Borrow the target document's style sheet. Sharing style sheet containers should be used with care, and
		// only within the same context.
		static_cast<ElementDocument&>(*cursor_proxy).SetStyleSheetContainer(document->style_sheet_container);
	}

	drag_clone = element_drag_clone.get();

	// Append the clone to the cursor proxy element.
	cursor_proxy->AppendChild(std::move(element_drag_clone));

	// Position the clone. Use projected mouse coordinates to handle any ancestor transforms.
	const Vector2f absolute_pos = element->GetAbsoluteOffset(BoxArea::Border);
	Vector2f projected_mouse_position = Vector2f(mouse_position);
	if (Element* parent = element->GetParentNode())
		parent->Project(projected_mouse_position);

	drag_clone->SetProperty(PropertyId::Position, Property(Style::Position::Absolute));
	drag_clone->SetProperty(PropertyId::Left, Property(absolute_pos.x - projected_mouse_position.x, Unit::PX));
	drag_clone->SetProperty(PropertyId::Top, Property(absolute_pos.y - projected_mouse_position.y, Unit::PX));
	// We remove margins so that percentage- and auto-margins are evaluated correctly.
	drag_clone->SetProperty(PropertyId::MarginLeft, Property(0.f, Unit::PX));
	drag_clone->SetProperty(PropertyId::MarginTop, Property(0.f, Unit::PX));
	drag_clone->SetPseudoClass("drag", true);
}